

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

Iterator __thiscall
Map<int,_bool>::insert(Map<int,_bool> *this,Iterator *position,int *key,bool *value)

{
  Item *pIVar1;
  Iterator IVar2;
  Item *next;
  Item *prev_1;
  Item *prev;
  Item *insertPos;
  bool *value_local;
  int *key_local;
  Iterator *position_local;
  Map<int,_bool> *this_local;
  
  pIVar1 = position->item;
  if (pIVar1 == &this->endItem) {
    pIVar1 = pIVar1->prev;
    if ((pIVar1 != (Item *)0x0) && (pIVar1->key < *key)) {
      IVar2 = insert(this,&pIVar1->right,pIVar1,key,value);
      return (Iterator)IVar2.item;
    }
  }
  else if (*key < pIVar1->key) {
    if ((pIVar1->prev == (Item *)0x0) || (pIVar1->prev->key < *key)) {
      IVar2 = insert(this,&pIVar1->left,pIVar1,key,value);
      return (Iterator)IVar2.item;
    }
  }
  else {
    if (*key <= pIVar1->key) {
      pIVar1->value = (bool)(*value & 1);
      Iterator::Iterator((Iterator *)&this_local,pIVar1);
      return (Iterator)(Item *)this_local;
    }
    if ((pIVar1->next == &this->endItem) || (*key < pIVar1->next->key)) {
      IVar2 = insert(this,&pIVar1->right,pIVar1,key,value);
      return (Iterator)IVar2.item;
    }
  }
  IVar2 = insert(this,&this->root,(Item *)0x0,key,value);
  return (Iterator)IVar2.item;
}

Assistant:

Iterator insert(const Iterator& position, const T& key, const V& value)
  {
    Item* insertPos = position.item;
    if(insertPos == &endItem)
    {
      Item* prev = insertPos->prev;
      if(prev && key > prev->key)
        return insert(&prev->right, prev, key, value);
    }
    else
    {
      if(key < insertPos->key)
      {
        Item* prev = insertPos->prev;
        if(!prev || key > prev->key)
          return insert(&insertPos->left, insertPos, key, value);
      }
      else if(key > insertPos->key)
      {
        Item* next = insertPos->next;
        if(next == &endItem || key < next->key)
          return insert(&insertPos->right, insertPos, key, value);
      }
      else
      {
        insertPos->value = value;
        return insertPos;
      }
    }
    return insert(&root, 0, key, value);
  }